

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_filename_journal(char *zFilename)

{
  int iVar1;
  int iVar2;
  char *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 uVar3;
  char *local_10;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_10 = databaseName(in_RDI);
    iVar1 = sqlite3Strlen30((char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    local_10 = local_10 + (iVar1 + 1);
    while( true ) {
      uVar3 = false;
      if (local_10 != (char *)0x0) {
        uVar3 = *local_10 != '\0';
      }
      if ((bool)uVar3 == false) break;
      iVar1 = sqlite3Strlen30((char *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
      iVar2 = sqlite3Strlen30((char *)CONCAT17(uVar3,in_stack_ffffffffffffffe8));
      local_10 = local_10 + (long)(iVar2 + 1) + (long)(iVar1 + 1);
    }
    local_8 = local_10 + 1;
  }
  return local_8;
}

Assistant:

SQLITE_API const char *sqlite3_filename_journal(const char *zFilename){
  if( zFilename==0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename + 1;
}